

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void uv__io_init(uv__io_t *w,uv__io_cb cb,int fd)

{
  if (cb == (uv__io_cb)0x0) {
    __assert_fail("cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                  ,0x35e,"void uv__io_init(uv__io_t *, uv__io_cb, int)");
  }
  if (-2 < fd) {
    w->pending_queue[0] = w->pending_queue;
    w->pending_queue[1] = w->pending_queue;
    w->watcher_queue[0] = w->watcher_queue;
    w->watcher_queue[1] = w->watcher_queue;
    w->cb = cb;
    w->fd = fd;
    w->pevents = 0;
    w->events = 0;
    return;
  }
  __assert_fail("fd >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/core.c"
                ,0x35f,"void uv__io_init(uv__io_t *, uv__io_cb, int)");
}

Assistant:

void uv__io_init(uv__io_t* w, uv__io_cb cb, int fd) {
  assert(cb != NULL);
  assert(fd >= -1);
  QUEUE_INIT(&w->pending_queue);
  QUEUE_INIT(&w->watcher_queue);
  w->cb = cb;
  w->fd = fd;
  w->events = 0;
  w->pevents = 0;

#if defined(UV_HAVE_KQUEUE)
  w->rcount = 0;
  w->wcount = 0;
#endif /* defined(UV_HAVE_KQUEUE) */
}